

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_GlobalSimpleStringMemoryAccountant_report_Test::testBody
          (TEST_GlobalSimpleStringMemoryAccountant_report_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  GlobalSimpleStringMemoryAccountant local_40 [2];
  undefined1 local_20 [8];
  SimpleString str;
  TEST_GlobalSimpleStringMemoryAccountant_report_Test *this_local;
  
  str.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)local_20,"");
  GlobalSimpleStringMemoryAccountant::start
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant);
  SimpleString::operator+=((SimpleString *)local_20,"More");
  GlobalSimpleStringMemoryAccountant::stop
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalSimpleStringMemoryAccountant).accountant);
  pUVar1 = UtestShell::getCurrent();
  GlobalSimpleStringMemoryAccountant::report(local_40);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_40);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1," 1                0                 1",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x8d);
  SimpleString::~SimpleString((SimpleString *)local_40);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(GlobalSimpleStringMemoryAccountant, report)
{
    SimpleString str;
    accountant.start();
    str += "More";
    accountant.stop();
    STRCMP_CONTAINS(" 1                0                 1", accountant.report().asCharString());
}